

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O1

TextureFormat tcu::getUncompressedFormat(CompressedTexFormat format)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  if (format < COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA) {
    uVar1 = *(ulong *)(&DAT_0037c2b0 + (ulong)format * 8);
    uVar2 = *(ulong *)(&DAT_0037c308 + (ulong)format * 8);
  }
  else if (format - COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA < 0x1c) {
    bVar3 = format - COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8 < 0xe;
    uVar1 = 0x2200000000;
    if (bVar3) {
      uVar1 = 0x300000000;
    }
    uVar2 = 8;
    if (bVar3) {
      uVar2 = 0xf;
    }
  }
  else {
    uVar2 = 0x15;
    uVar1 = 0x2600000000;
  }
  return (TextureFormat)(uVar1 | uVar2);
}

Assistant:

bool isEtcFormat (CompressedTexFormat format)
{
	switch (format)
	{
		case COMPRESSEDTEXFORMAT_ETC1_RGB8:
		case COMPRESSEDTEXFORMAT_EAC_R11:
		case COMPRESSEDTEXFORMAT_EAC_SIGNED_R11:
		case COMPRESSEDTEXFORMAT_EAC_RG11:
		case COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11:
		case COMPRESSEDTEXFORMAT_ETC2_RGB8:
		case COMPRESSEDTEXFORMAT_ETC2_SRGB8:
		case COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1:
		case COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1:
		case COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8:
		case COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8:
			return true;

		default:
			return false;
	}
}